

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O1

bool DoesCodecProduceOriginals
               (WirehairCodec decoder,uint N,uint blockBytes,uint finalBytes,uint8_t *message,
               uint8_t *decodedMessage,uint messageBytes)

{
  WirehairResult WVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  uint8_t *__s1;
  ulong uVar7;
  bool bVar8;
  uint32_t recoveredBytes;
  uint32_t local_54;
  ulong local_50;
  uint8_t *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar7 = (ulong)messageBytes;
  decodedMessage[uVar7] = 0xee;
  local_48 = message;
  WVar1 = wirehair_recover(decoder,decodedMessage,uVar7);
  if (WVar1 == Wirehair_Success) {
    iVar2 = bcmp(local_48,decodedMessage,uVar7);
    if (iVar2 == 0) {
      if (decodedMessage[uVar7] == 0xee) {
        bVar8 = N == 0;
        if (bVar8) {
          return bVar8;
        }
        local_50 = (ulong)finalBytes;
        local_38 = (ulong)(N - 1);
        local_40 = (ulong)blockBytes;
        uVar7 = 0;
        __s1 = local_48;
        while( true ) {
          decodedMessage[local_50] = 0xee;
          local_54 = 0;
          WVar1 = wirehair_recover_block(decoder,(uint)uVar7,decodedMessage,&local_54);
          if (WVar1 != Wirehair_Success) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Failed to wirehair_recover_block with original pieces for N = ",0x3e);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", i = ",6);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            return bVar8;
          }
          uVar3 = blockBytes;
          if ((local_38 == uVar7) && (uVar3 = finalBytes, decodedMessage[local_50] != 0xee)) break;
          iVar2 = bcmp(__s1,decodedMessage,(ulong)uVar3);
          if (iVar2 != 0) {
            pcVar6 = "Failed to wirehair_recover_block the data with original pieces for N = ";
            lVar5 = 0x47;
            goto LAB_001037b3;
          }
          uVar7 = uVar7 + 1;
          bVar8 = N <= uVar7;
          __s1 = __s1 + local_40;
          if (N == uVar7) {
            return bVar8;
          }
        }
        pcVar6 = "Failed to wirehair_recover_block memory corruption with original pieces for N = ";
        lVar5 = 0x50;
LAB_001037b3:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar4);
        return bVar8;
      }
      pcVar6 = "Failed to recover buffer overrun with original pieces for N = ";
      lVar5 = 0x3e;
    }
    else {
      pcVar6 = "Failed to recover the data with original pieces for N = ";
      lVar5 = 0x38;
    }
  }
  else {
    pcVar6 = "Failed to recover with original pieces for N = ";
    lVar5 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return false;
}

Assistant:

static bool DoesCodecProduceOriginals(
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    // Check buffer overflow
    decodedMessage[messageBytes] = kPadChar;

    WirehairResult recoverResult = wirehair_recover(decoder, decodedMessage, messageBytes);

    if (recoverResult != Wirehair_Success)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover with original pieces for N = " << N << endl;
        return false;
    }

    if (0 != memcmp(message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover the data with original pieces for N = " << N << endl;
        return false;
    }

    if (decodedMessage[messageBytes] != kPadChar)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover buffer overrun with original pieces for N = " << N << endl;
        return false;
    }

    for (unsigned i = 0; i < N; ++i)
    {
        decodedMessage[finalBytes] = kPadChar;

        uint32_t recoveredBytes = 0;
        WirehairResult blockResult = wirehair_recover_block(decoder, i, decodedMessage, &recoveredBytes);

        if (blockResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block with original pieces for N = " << N << ", i = " << i << endl;
            return false;
        }

        if ((i == N - 1) && decodedMessage[finalBytes] != kPadChar)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block memory corruption with original pieces for N = " << N << endl;
            return false;
        }

        const unsigned expectedBytes = (i == N - 1) ? finalBytes : blockBytes;

        if (0 != memcmp(message + i * blockBytes, decodedMessage, expectedBytes))
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block the data with original pieces for N = " << N << endl;
            return false;
        }
    }

    return true;
}